

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifcvn(bifcxdef *ctx,int argc)

{
  char cVar1;
  ushort uVar2;
  runsdef *prVar3;
  runcxdef *ctx_00;
  ushort *puVar4;
  bool bVar5;
  char *pcVar6;
  ushort **ppuVar7;
  anon_union_8_4_1dda36f5_for_runsv aVar8;
  ulong uVar9;
  dattyp typ;
  anon_union_8_4_1dda36f5_for_runsv aVar10;
  long lVar11;
  int iVar12;
  char *pcVar13;
  runsdef val;
  runsdef local_40;
  
  prVar3 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar3 + -1;
  ctx_00 = ctx->bifcxrun;
  if (prVar3[-1].runstyp != '\x03') {
    ctx_00->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3ef);
  }
  puVar4 = (ushort *)(ctx_00->runcxsp->runsv).runsvstr;
  uVar2 = *puVar4;
  if (uVar2 == 6) {
    if (*(int *)(puVar4 + 1) == 0x65757274) {
      typ = 8;
      goto LAB_0020cfac;
    }
  }
  else if ((uVar2 == 5) && ((char)puVar4[2] == 'l' && puVar4[1] == 0x696e)) {
    typ = 5;
    goto LAB_0020cfac;
  }
  if (uVar2 == 2) {
    aVar10.runsvnum = 0;
  }
  else {
    aVar10.runsvnum = 0;
    lVar11 = 0;
    do {
      cVar1 = *(char *)((long)puVar4 + lVar11 + 2);
      if ((long)cVar1 < 0) {
        iVar12 = (uint)uVar2 - (int)lVar11;
LAB_0020cf5b:
        iVar12 = iVar12 + -2;
        pcVar13 = (char *)((long)puVar4 + lVar11 + 2);
        bVar5 = true;
        goto LAB_0020cf69;
      }
      ppuVar7 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar7 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
        if (cVar1 != '-') {
          iVar12 = (int)((ulong)uVar2 - lVar11);
          goto LAB_0020cf5b;
        }
        uVar9 = ((ulong)uVar2 - lVar11) - 3 & 0xffffffff;
        pcVar6 = (char *)((long)puVar4 + lVar11 + 3);
        goto LAB_0020cf2d;
      }
      lVar11 = lVar11 + 1;
    } while (uVar2 - 2 != (int)lVar11);
  }
  goto LAB_0020cfa2;
  while ((-1 < (long)*pcVar13 &&
         (pcVar6 = pcVar13 + 1, (*(byte *)((long)*ppuVar7 + (long)*pcVar13 * 2 + 1) & 0x20) != 0)))
  {
LAB_0020cf2d:
    pcVar13 = pcVar6;
    iVar12 = (int)uVar9;
    uVar9 = (ulong)(iVar12 - 1);
    aVar10.runsvnum = 0;
    if (iVar12 == 0) goto LAB_0020cfa2;
  }
  bVar5 = false;
LAB_0020cf69:
  ppuVar7 = __ctype_b_loc();
  lVar11 = 0;
  aVar8.runsvnum = 0;
  do {
    if ((*(byte *)((long)*ppuVar7 + (ulong)(byte)pcVar13[lVar11] * 2 + 1) & 8) == 0) break;
    aVar8.runsvstr = (uchar *)((ulong)(byte)pcVar13[lVar11] + aVar8.runsvnum * 10 + -0x30);
    lVar11 = lVar11 + 1;
  } while (iVar12 != (int)lVar11);
  aVar10.runsvnum = -aVar8.runsvnum;
  if (bVar5) {
    aVar10 = aVar8;
  }
LAB_0020cfa2:
  typ = 1;
  local_40.runsv = aVar10;
LAB_0020cfac:
  runpush(ctx_00,typ,&local_40);
  return;
}

Assistant:

void bifcvn(bifcxdef *ctx, int argc)
{
    runsdef  val;
    uchar   *p;
    int      len;
    int      typ;
    long     acc;
    int      neg;
    
    bifcntargs(ctx, 1, argc);
    p = runpopstr(ctx->bifcxrun);
    len = osrp2(p) - 2;
    p += 2;
    
    if (len == 3 && !memcmp(p, "nil", (size_t)3))
        typ = DAT_NIL;
    else if (len == 4 && !memcmp(p, "true", (size_t)4))
        typ = DAT_TRUE;
    else
    {
        typ = DAT_NUMBER;
        for ( ; len != 0 && t_isspace(*p) ; ++p, --len) ;
        if (len != 0 && *p == '-')
        {
            neg = TRUE;
            for (++p, --len ; len != 0 && t_isspace(*p) ; ++p, --len) ;
        }
        else neg = FALSE;

        /* accumulate the number digit by digit */
        for (acc = 0 ; len != 0 && isdigit(*p) ; ++p, --len)
            acc = (acc << 3) + (acc << 1) + ((*p) - '0');

        if (neg) acc = -acc;
        val.runsv.runsvnum = acc;
    }
    
    runpush(ctx->bifcxrun, typ, &val);
}